

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O2

int ggwave_decode(ggwave_Instance id,void *waveformBuffer,int waveformSize,void *payloadBuffer)

{
  GGWave *this;
  bool bVar1;
  uint uVar2;
  TxRxData *dst;
  
  this = (GGWave *)(&(anonymous_namespace)::g_instances)[id];
  bVar1 = GGWave::decode(this,waveformBuffer,waveformSize);
  if (bVar1) {
    dst = (TxRxData *)__tls_get_addr(&PTR_0010ffb8);
    if (*(char *)&dst[1].m_data == '\0') {
      dst->m_data = (uchar *)0x0;
      dst->m_size = 0;
      *(undefined1 *)&dst[1].m_data = 1;
    }
    uVar2 = GGWave::rxTakeData(this,dst);
    if (uVar2 == 0xffffffff) {
      uVar2 = 0xffffffff;
    }
    else if (0 < (int)uVar2) {
      memcpy(payloadBuffer,dst->m_data,(ulong)uVar2);
    }
  }
  else {
    uVar2 = 0xffffffff;
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      fprintf((anonymous_namespace)::g_fptr,"Failed to decode data - GGWave instance %d\n",
              (ulong)(uint)id);
    }
  }
  return uVar2;
}

Assistant:

int ggwave_decode(
        ggwave_Instance id,
        const void * waveformBuffer,
        int waveformSize,
        void * payloadBuffer) {
    GGWave * ggWave = (GGWave *) g_instances[id];

    if (ggWave->decode(waveformBuffer, waveformSize) == false) {
        ggprintf("Failed to decode data - GGWave instance %d\n", id);
        return -1;
    }

    static thread_local GGWave::TxRxData data;

    const auto dataLength = ggWave->rxTakeData(data);
    if (dataLength == -1) {
        // failed to decode message
        return -1;
    } else if (dataLength > 0) {
        memcpy(payloadBuffer, data.data(), dataLength);
    }

    return dataLength;
}